

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_helper.cpp
# Opt level: O0

void Unit_Test::generateOffset(Image *image,uint32_t *x,uint32_t *y,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint *in_RDX;
  uint *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
  uVar1 = Test_Helper::randomValue<unsigned_int>(0x18b5b1);
  *in_RSI = uVar1;
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
  uVar1 = Test_Helper::randomValue<unsigned_int>(0x18b5cf);
  *in_RDX = uVar1;
  return;
}

Assistant:

void generateOffset( const PenguinV_Image::Image & image, uint32_t & x, uint32_t & y, uint32_t width, uint32_t height )
    {
        x = randomValue<uint32_t>( image.width()  - width );
        y = randomValue<uint32_t>( image.height() - height );
    }